

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O2

Own<const_kj::Executor,_std::nullptr_t> __thiscall kj::_::ExecutorImpl::addRef(ExecutorImpl *this)

{
  Executor *extraout_RDX;
  Disposer *in_RSI;
  Own<const_kj::Executor,_std::nullptr_t> OVar1;
  Own<const_kj::_::ExecutorImpl,_std::nullptr_t> local_18;
  
  LOCK();
  *(int *)&in_RSI[4]._vptr_Disposer = *(int *)&in_RSI[4]._vptr_Disposer + 1;
  UNLOCK();
  local_18.disposer = in_RSI + 3;
  (this->super_Executor)._vptr_Executor = (_func_int **)local_18.disposer;
  (this->super_Executor).impl.disposer = in_RSI;
  local_18.ptr = (ExecutorImpl *)0x0;
  Own<const_kj::_::ExecutorImpl,_std::nullptr_t>::dispose(&local_18);
  OVar1.ptr = extraout_RDX;
  OVar1.disposer = (Disposer *)this;
  return OVar1;
}

Assistant:

kj::Own<const Executor> addRef() const override {
    return kj::atomicAddRef(*this);
  }